

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

void __thiscall
sjtu::
map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
::insert_fixup(map<long,_sjtu::LRUCache<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>::CacheNode_*,_std::less<long>_>
               *this,Node *x)

{
  color_type cVar1;
  Node *pNVar2;
  Node *y;
  Node *pNVar3;
  Node *pNVar4;
  Node **ppNVar5;
  Node *pNVar6;
  
  pNVar3 = x->parent;
  if (pNVar3->color == RED) {
    ppNVar5 = &x->parent;
    do {
      pNVar2 = pNVar3->parent;
      pNVar6 = pNVar2->left;
      pNVar4 = pNVar3;
      if (pNVar6 == pNVar3) {
        pNVar6 = pNVar2->right;
        if (pNVar6->color != RED) {
          pNVar6 = pNVar3->right;
          if (pNVar6 == x) {
            pNVar6 = x->left;
            if (pNVar6 != this->nil) {
              pNVar6->parent = pNVar3;
              pNVar2 = pNVar3->parent;
              pNVar4 = pNVar2->left;
            }
            pNVar3->right = pNVar6;
            (&pNVar2->left)[pNVar4 != pNVar3] = x;
            *ppNVar5 = pNVar2;
            pNVar3->parent = x;
            x->left = pNVar3;
            pNVar6 = x->right;
            pNVar2 = x->parent;
            pNVar4 = x;
            x = pNVar3;
          }
          if (pNVar6 != this->nil) {
            pNVar6->parent = pNVar2;
          }
          pNVar2->left = pNVar6;
          pNVar3 = pNVar2->parent;
          (&pNVar3->left)[pNVar3->left != pNVar2] = pNVar4;
          pNVar4->parent = pNVar3;
          pNVar2->parent = pNVar4;
          pNVar4->right = pNVar2;
          goto LAB_00115e0b;
        }
LAB_00115d1b:
        pNVar6->color = BLACK;
        pNVar3->color = BLACK;
        x = pNVar6->parent;
        x->color = RED;
      }
      else {
        if (pNVar6->color == RED) goto LAB_00115d1b;
        pNVar6 = pNVar3->left;
        if (pNVar6 == x) {
          pNVar6 = x->right;
          if (pNVar6 != this->nil) {
            pNVar6->parent = pNVar3;
            pNVar2 = pNVar3->parent;
          }
          pNVar3->left = pNVar6;
          (&pNVar2->left)[pNVar2->left != pNVar3] = x;
          *ppNVar5 = pNVar2;
          pNVar3->parent = x;
          x->right = pNVar3;
          pNVar6 = x->left;
          pNVar2 = x->parent;
          pNVar4 = x;
          x = pNVar3;
        }
        if (pNVar6 != this->nil) {
          pNVar6->parent = pNVar2;
        }
        pNVar2->right = pNVar6;
        pNVar3 = pNVar2->parent;
        (&pNVar3->left)[pNVar3->left != pNVar2] = pNVar4;
        pNVar4->parent = pNVar3;
        pNVar2->parent = pNVar4;
        pNVar4->left = pNVar2;
LAB_00115e0b:
        cVar1 = pNVar4->color;
        pNVar4->color = pNVar2->color;
        pNVar2->color = cVar1;
      }
      ppNVar5 = &x->parent;
      pNVar3 = x->parent;
    } while (pNVar3->color == RED);
  }
  this->nil->left->color = BLACK;
  return;
}

Assistant:

void insert_fixup(Node *x)
	{
		for (Node *y;x -> parent -> color == RED;)
			if (x -> parent -> parent -> left == x -> parent)
			{
				y = x -> parent -> parent -> right;
				if (y -> color == RED)
				{
					x -> parent -> color = y -> color = BLACK , y -> parent -> color = RED;
					x = y -> parent;
				}
				else
				{
					y = x -> parent;
					if (y -> right == x) left_rotate(x) , x = y , y = x -> parent;
					right_rotate(y) , std::swap(y -> color , y -> right -> color);
				}
			}
			else
			{
				y = x -> parent -> parent -> left;
				if (y -> color == RED)
				{
					x -> parent -> color = y -> color = BLACK , y -> parent -> color = RED;
					x = y -> parent;
				}
				else
				{
					y = x -> parent;
					if (y -> left == x) right_rotate(x) , x = y , y = x -> parent;
					left_rotate(y) , std::swap(y -> color , y -> left -> color);
				}
			}
		nil -> left -> color = BLACK;
	}